

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slgh_compile.cc
# Opt level: O1

bool __thiscall
ConsistencyChecker::checkConstructorSection
          (ConsistencyChecker *this,Constructor *ct,ConstructTpl *cttpl)

{
  bool bVar1;
  bool bVar2;
  pointer ppOVar3;
  
  bVar2 = true;
  if ((cttpl != (ConstructTpl *)0x0) &&
     (ppOVar3 = (cttpl->vec).super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>._M_impl.
                super__Vector_impl_data._M_start,
     ppOVar3 !=
     (cttpl->vec).super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>._M_impl.
     super__Vector_impl_data._M_finish)) {
    bVar2 = true;
    do {
      bVar1 = sizeRestriction(this,*ppOVar3,ct);
      if (!bVar1) {
        bVar2 = false;
      }
      checkOpMisuse(this,*ppOVar3,ct);
      ppOVar3 = ppOVar3 + 1;
    } while (ppOVar3 !=
             (cttpl->vec).super__Vector_base<OpTpl_*,_std::allocator<OpTpl_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return bVar2;
}

Assistant:

bool ConsistencyChecker::checkConstructorSection(Constructor *ct,ConstructTpl *cttpl)

{ // Check all the OpTpl s within the given section for consistency, return true if all tests pass
  if (cttpl == (ConstructTpl *)0)
    return true;		// Nothing to check
  vector<OpTpl *>::const_iterator iter;
  const vector<OpTpl *> &ops(cttpl->getOpvec());
  bool testresult = true;

  for(iter=ops.begin();iter!=ops.end();++iter) {
    if (!sizeRestriction(*iter,ct))
      testresult = false;
    if (!checkOpMisuse(*iter,ct))
      testresult = false;
  }
  return testresult;
}